

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recompose.hpp
# Opt level: O2

void __thiscall
MGARD::Recomposer<float>::recompose_level_1D
          (Recomposer<float> *this,float *data_pos,size_t n,float h,bool nodal_row)

{
  size_t n_nodal;
  float *nodal_buffer;
  ostream *poVar1;
  undefined7 in_register_00000009;
  float *coeff_buffer;
  size_t n_coeff;
  
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::endl<char,std::char_traits<char>>(poVar1);
  n_nodal = (n >> 1) + 1;
  n_coeff = n - n_nodal;
  memcpy(this->data_buffer,data_pos,n << 2);
  nodal_buffer = this->data_buffer;
  coeff_buffer = nodal_buffer + (n >> 1) + 1;
  if ((int)CONCAT71(in_register_00000009,nodal_row) == 0) {
    compute_load_vector_coeff_row<float>
              (this->load_v_buffer,n_nodal,n_coeff,h,nodal_buffer,coeff_buffer);
  }
  else {
    compute_load_vector_nodal_row<float>(this->load_v_buffer,n_nodal,n_coeff,h,coeff_buffer);
  }
  compute_correction<float>(this->correction_buffer,n_nodal,h,this->load_v_buffer);
  subtract_correction(this,n_nodal,nodal_buffer);
  recover_from_interpolant_difference_1D(this,n_coeff,nodal_buffer,coeff_buffer);
  data_reverse_reorder_1D<float>(data_pos,(int)n_nodal,(int)n_coeff,nodal_buffer,coeff_buffer);
  return;
}

Assistant:

void recompose_level_1D(T * data_pos, size_t n, T h, bool nodal_row=true){
		cerr << n << endl;
		size_t n_nodal = (n >> 1) + 1;
		size_t n_coeff = n - n_nodal;
		memcpy(data_buffer, data_pos, n*sizeof(T));
		T * nodal_buffer = data_buffer;
		T * coeff_buffer = data_buffer + n_nodal;
		if(nodal_row) compute_load_vector_nodal_row(load_v_buffer, n_nodal, n_coeff, h, coeff_buffer);
        else compute_load_vector_coeff_row(load_v_buffer, n_nodal, n_coeff, h, nodal_buffer, coeff_buffer);
		compute_correction(correction_buffer, n_nodal, h, load_v_buffer);
		subtract_correction(n_nodal, nodal_buffer);
		recover_from_interpolant_difference_1D(n_coeff, nodal_buffer, coeff_buffer);
		data_reverse_reorder_1D(data_pos, n_nodal, n_coeff, nodal_buffer, coeff_buffer);
	}